

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishInteger(HelicsPublication pub,int64_t val,HelicsError *err)

{
  HelicsPublication pvVar1;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a84e4;
    }
    else {
      pvVar1 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar1 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001a84e6;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a84e4:
  pvVar1 = (HelicsPublication)0x0;
LAB_001a84e6:
  if (pvVar1 != (HelicsPublication)0x0) {
    helics::Publication::publishInt(*(Publication **)((long)pvVar1 + 0x18),val);
  }
  return;
}

Assistant:

void helicsPublicationPublishInteger(HelicsPublication pub, int64_t val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}